

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

void __thiscall
TTD::EventLog::ReplayPropertyEnumEvent
          (EventLog *this,ScriptContext *requestContext,BOOL *returnCode,BigPropertyIndex *newIndex,
          DynamicObject *obj,PropertyId *pid,PropertyAttributes *attributes,
          JavascriptString **propertyName)

{
  uint propertyId;
  long *plVar1;
  int iVar2;
  BigPropertyIndex BVar3;
  PropertyEnumStepEventLogEntry *pPVar4;
  PropertyString *pPVar5;
  PropertyRecord *pPVar6;
  
  pPVar4 = ReplayGetReplayEvent_Helper<TTD::NSLogEvents::PropertyEnumStepEventLogEntry,(TTD::NSLogEvents::EventKind)8>
                     (this);
  *returnCode = pPVar4->ReturnCode;
  *pid = pPVar4->Pid;
  *attributes = pPVar4->Attributes;
  if (*returnCode == 0) {
    *propertyName = (JavascriptString *)0x0;
    BVar3 = (**(code **)(**(long **)((obj->super_RecyclableObject).type.ptr + 1) + 0x30))();
    *newIndex = BVar3;
  }
  else {
    propertyId = *pid;
    if (propertyId == 0xffffffff) {
      TTDAbort_unrecoverable_error("This is so weird we need to figure out what this means.");
    }
    if (propertyId < 0x10) {
      TTDAbort_unrecoverable_error("We should skip recording this.");
    }
    pPVar5 = Js::ScriptContext::GetPropertyString(requestContext,propertyId);
    *propertyName = &pPVar5->super_JavascriptString;
    pPVar6 = Js::ScriptContext::GetPropertyName(requestContext,*pid);
    plVar1 = *(long **)((obj->super_RecyclableObject).type.ptr + 1);
    iVar2 = (**(code **)(*plVar1 + 0x330))(plVar1,pPVar6);
    *newIndex = iVar2;
    if (iVar2 == -1) {
      TTDAbort_unrecoverable_error
                ("If *returnCode is true then we found it during record -- but missing in replay.");
    }
  }
  return;
}

Assistant:

void EventLog::ReplayPropertyEnumEvent(Js::ScriptContext* requestContext, BOOL* returnCode, Js::BigPropertyIndex* newIndex, const Js::DynamicObject* obj, Js::PropertyId* pid, Js::PropertyAttributes* attributes, Js::JavascriptString** propertyName)
    {
        const NSLogEvents::PropertyEnumStepEventLogEntry* peEvent = this->ReplayGetReplayEvent_Helper<NSLogEvents::PropertyEnumStepEventLogEntry, NSLogEvents::EventKind::PropertyEnumTag>();

        *returnCode = peEvent->ReturnCode;
        *pid = peEvent->Pid;
        *attributes = peEvent->Attributes;

        if(*returnCode)
        {
            TTDAssert(*pid != Js::Constants::NoProperty, "This is so weird we need to figure out what this means.");
            TTDAssert(!Js::IsInternalPropertyId(*pid), "We should skip recording this.");

            Js::PropertyString* propertyString = requestContext->GetPropertyString(*pid);
            *propertyName = propertyString;

            const Js::PropertyRecord* pRecord = requestContext->GetPropertyName(*pid);
            *newIndex = obj->GetDynamicType()->GetTypeHandler()->GetPropertyIndex_EnumerateTTD(pRecord);

            TTDAssert(*newIndex != Js::Constants::NoBigSlot, "If *returnCode is true then we found it during record -- but missing in replay.");
        }
        else
        {
            *propertyName = nullptr;

            *newIndex = obj->GetDynamicType()->GetTypeHandler()->GetPropertyCount();
        }

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteEnumAction(this->m_eventTimeCtr - 1, *returnCode, *pid, *attributes, *propertyName);
#endif
    }